

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall
llvm::detail::IEEEFloat::roundAwayFromZero
          (IEEEFloat *this,roundingMode rounding_mode,lostFraction lost_fraction,uint bit)

{
  byte bVar1;
  int iVar2;
  Significand *parts;
  bool bVar3;
  
  bVar1 = this->field_0x12;
  if ((bVar1 & 7) != 3 && (bVar1 & 6) == 0) {
    __assert_fail("isFiniteNonZero() || category == fcZero",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4da,
                  "bool llvm::detail::IEEEFloat::roundAwayFromZero(roundingMode, lostFraction, unsigned int) const"
                 );
  }
  if (lost_fraction == lfExactlyZero) {
    __assert_fail("lost_fraction != lfExactlyZero",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4dd,
                  "bool llvm::detail::IEEEFloat::roundAwayFromZero(roundingMode, lostFraction, unsigned int) const"
                 );
  }
  switch(rounding_mode) {
  case rmNearestTiesToEven:
    if (lost_fraction == lfMoreThanHalf) {
      return true;
    }
    if ((lost_fraction == lfExactlyHalf) && ((bVar1 & 7) != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        parts = (Significand *)(this->significand).parts;
      }
      else {
        parts = &this->significand;
      }
      iVar2 = APInt::tcExtractBit(&parts->part,bit);
      return iVar2 != 0;
    }
  case rmTowardZero:
    bVar3 = false;
    break;
  case rmTowardPositive:
    bVar3 = (bVar1 & 8) == 0;
    break;
  case rmTowardNegative:
    bVar3 = (bool)((bVar1 & 8) >> 3);
    break;
  case rmNearestTiesToAway:
    bVar3 = (lost_fraction & ~lfLessThanHalf) == lfExactlyHalf;
    break;
  default:
    llvm_unreachable_internal
              ("Invalid rounding mode found",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x4f6);
  }
  return bVar3;
}

Assistant:

bool IEEEFloat::roundAwayFromZero(roundingMode rounding_mode,
                                  lostFraction lost_fraction,
                                  unsigned int bit) const {
  /* NaNs and infinities should not have lost fractions.  */
  assert(isFiniteNonZero() || category == fcZero);

  /* Current callers never pass this so we don't handle it.  */
  assert(lost_fraction != lfExactlyZero);

  switch (rounding_mode) {
  case rmNearestTiesToAway:
    return lost_fraction == lfExactlyHalf || lost_fraction == lfMoreThanHalf;

  case rmNearestTiesToEven:
    if (lost_fraction == lfMoreThanHalf)
      return true;

    /* Our zeroes don't have a significand to test.  */
    if (lost_fraction == lfExactlyHalf && category != fcZero)
      return APInt::tcExtractBit(significandParts(), bit);

    return false;

  case rmTowardZero:
    return false;

  case rmTowardPositive:
    return !sign;

  case rmTowardNegative:
    return sign;
  }
  llvm_unreachable("Invalid rounding mode found");
}